

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

int __thiscall
cmGlobalGenerator::Build
          (cmGlobalGenerator *this,string *param_1,string *bindir,string *projectName,string *target
          ,string *output,string *makeCommandCSTR,string *config,bool clean,bool fast,bool verbose,
          double timeout,OutputOption outputflag,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *nativeOptions)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int retVal;
  allocator local_109;
  string makeCommandStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cleanCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  makeCommand;
  string outputBuffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  cmWorkingDirectory workdir;
  
  cmWorkingDirectory::cmWorkingDirectory(&workdir,bindir);
  std::__cxx11::string::append((char *)output);
  std::__cxx11::string::append((string *)output);
  std::__cxx11::string::append((char *)output);
  bVar1 = cmSystemTools::s_RunCommandHideConsole;
  cmSystemTools::s_RunCommandHideConsole = true;
  outputBuffer._M_dataplus._M_p = (pointer)&outputBuffer.field_2;
  outputBuffer._M_string_length = 0;
  outputBuffer.field_2._M_local_buf[0] = '\0';
  makeCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  makeCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  makeCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (*this->_vptr_cmGlobalGenerator[0xe])
            (this,&makeCommand,makeCommandCSTR,projectName,bindir,target,config,(ulong)fast,
             (ulong)verbose,nativeOptions);
  if (outputflag == OUTPUT_PASSTHROUGH) {
    if (makeCommand.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        makeCommand.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      outputflag = OUTPUT_PASSTHROUGH;
    }
    else {
      cmsys::SystemTools::GetFilenameName
                ((string *)&cleanCommand,
                 makeCommand.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      cmsys::SystemTools::LowerCase(&makeCommandStr,(string *)&cleanCommand);
      bVar2 = std::operator==(&makeCommandStr,"vcexpress.exe");
      std::__cxx11::string::~string((string *)&makeCommandStr);
      std::__cxx11::string::~string((string *)&cleanCommand);
      outputflag = bVar2 ^ OUTPUT_PASSTHROUGH;
    }
  }
  if (clean) {
    cleanCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cleanCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cleanCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&makeCommandStr,"clean",&local_109);
    local_78.field_2._M_allocated_capacity = 0;
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    (*this->_vptr_cmGlobalGenerator[0xe])
              (this,&cleanCommand,makeCommandCSTR,projectName,bindir,&makeCommandStr,config,
               (ulong)fast,(ulong)verbose,&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_78);
    std::__cxx11::string::~string((string *)&makeCommandStr);
    std::__cxx11::string::append((char *)output);
    cmSystemTools::PrintSingleCommand(&makeCommandStr,&cleanCommand);
    std::__cxx11::string::append((string *)output);
    std::__cxx11::string::~string((string *)&makeCommandStr);
    std::__cxx11::string::append((char *)output);
    bVar2 = cmSystemTools::RunSingleCommand
                      (&cleanCommand,&outputBuffer,&outputBuffer,&retVal,(char *)0x0,outputflag,
                       timeout,Auto);
    if (bVar2) {
      std::__cxx11::string::append((string *)output);
    }
    else {
      cmSystemTools::s_RunCommandHideConsole = bVar1;
      cmSystemTools::Error
                ("Generator: execution of make clean failed.",(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::append((string *)output);
      std::__cxx11::string::append((char *)output);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cleanCommand);
    if (!bVar2) {
      iVar4 = 1;
      goto LAB_00389d84;
    }
  }
  cmSystemTools::PrintSingleCommand(&makeCommandStr,&makeCommand);
  std::__cxx11::string::append((char *)output);
  std::__cxx11::string::append((string *)output);
  std::__cxx11::string::append((char *)output);
  bVar2 = cmSystemTools::RunSingleCommand
                    (&makeCommand,&outputBuffer,&outputBuffer,&retVal,(char *)0x0,outputflag,timeout
                     ,Auto);
  if (bVar2) {
    std::__cxx11::string::append((string *)output);
    iVar4 = retVal;
    cmSystemTools::s_RunCommandHideConsole = bVar1;
    if ((retVal == 0) &&
       (lVar3 = std::__cxx11::string::find((char *)output,0x51d9e1), iVar4 = retVal, lVar3 != -1)) {
      retVal = 1;
      goto LAB_00389d72;
    }
  }
  else {
    cmSystemTools::s_RunCommandHideConsole = bVar1;
    cmSystemTools::Error
              ("Generator: execution of make failed. Make command was: ",
               makeCommandStr._M_dataplus._M_p,(char *)0x0,(char *)0x0);
    std::__cxx11::string::append((string *)output);
    std::operator+(&local_78,"\nGenerator: execution of make failed. Make command was: ",
                   &makeCommandStr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cleanCommand,&local_78,"\n");
    std::__cxx11::string::append((string *)output);
    std::__cxx11::string::~string((string *)&cleanCommand);
    std::__cxx11::string::~string((string *)&local_78);
LAB_00389d72:
    iVar4 = 1;
  }
  std::__cxx11::string::~string((string *)&makeCommandStr);
LAB_00389d84:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&makeCommand);
  std::__cxx11::string::~string((string *)&outputBuffer);
  cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  return iVar4;
}

Assistant:

int cmGlobalGenerator::Build(const std::string& /*unused*/,
                             const std::string& bindir,
                             const std::string& projectName,
                             const std::string& target, std::string& output,
                             const std::string& makeCommandCSTR,
                             const std::string& config, bool clean, bool fast,
                             bool verbose, double timeout,
                             cmSystemTools::OutputOption outputflag,
                             std::vector<std::string> const& nativeOptions)
{
  /**
   * Run an executable command and put the stdout in output.
   */
  cmWorkingDirectory workdir(bindir);
  output += "Change Dir: ";
  output += bindir;
  output += "\n";

  int retVal;
  bool hideconsole = cmSystemTools::GetRunCommandHideConsole();
  cmSystemTools::SetRunCommandHideConsole(true);
  std::string outputBuffer;
  std::string* outputPtr = &outputBuffer;

  std::vector<std::string> makeCommand;
  this->GenerateBuildCommand(makeCommand, makeCommandCSTR, projectName, bindir,
                             target, config, fast, verbose, nativeOptions);

  // Workaround to convince VCExpress.exe to produce output.
  if (outputflag == cmSystemTools::OUTPUT_PASSTHROUGH &&
      !makeCommand.empty() &&
      cmSystemTools::LowerCase(
        cmSystemTools::GetFilenameName(makeCommand[0])) == "vcexpress.exe") {
    outputflag = cmSystemTools::OUTPUT_FORWARD;
  }

  // should we do a clean first?
  if (clean) {
    std::vector<std::string> cleanCommand;
    this->GenerateBuildCommand(cleanCommand, makeCommandCSTR, projectName,
                               bindir, "clean", config, fast, verbose);
    output += "\nRun Clean Command:";
    output += cmSystemTools::PrintSingleCommand(cleanCommand);
    output += "\n";

    if (!cmSystemTools::RunSingleCommand(cleanCommand, outputPtr, outputPtr,
                                         &retVal, CM_NULLPTR, outputflag,
                                         timeout)) {
      cmSystemTools::SetRunCommandHideConsole(hideconsole);
      cmSystemTools::Error("Generator: execution of make clean failed.");
      output += *outputPtr;
      output += "\nGenerator: execution of make clean failed.\n";

      return 1;
    }
    output += *outputPtr;
  }

  // now build
  std::string makeCommandStr = cmSystemTools::PrintSingleCommand(makeCommand);
  output += "\nRun Build Command:";
  output += makeCommandStr;
  output += "\n";

  if (!cmSystemTools::RunSingleCommand(makeCommand, outputPtr, outputPtr,
                                       &retVal, CM_NULLPTR, outputflag,
                                       timeout)) {
    cmSystemTools::SetRunCommandHideConsole(hideconsole);
    cmSystemTools::Error(
      "Generator: execution of make failed. Make command was: ",
      makeCommandStr.c_str());
    output += *outputPtr;
    output += "\nGenerator: execution of make failed. Make command was: " +
      makeCommandStr + "\n";

    return 1;
  }
  output += *outputPtr;
  cmSystemTools::SetRunCommandHideConsole(hideconsole);

  // The SGI MipsPro 7.3 compiler does not return an error code when
  // the source has a #error in it!  This is a work-around for such
  // compilers.
  if ((retVal == 0) && (output.find("#error") != std::string::npos)) {
    retVal = 1;
  }

  return retVal;
}